

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O0

int AF_A_SorcFX2Split(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  MetaClass *pMVar1;
  AActor *pAVar2;
  FState *pFVar3;
  bool bVar4;
  bool local_92;
  bool local_8f;
  FName local_8c;
  DVector3 local_88;
  FName local_6c;
  DVector3 local_68;
  AActor *local_50;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0x2ed,"int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_8f = true;
    if (stateowner != (AActor *)0x0) {
      local_8f = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_8f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                    ,0x2ed,"int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar4 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                      ,0x2ed,
                      "int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_92 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_92 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_92 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                      ,0x2ed,
                      "int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar4 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                      ,0x2ed,
                      "int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      mo = (AActor *)pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      mo = (AActor *)0x0;
    }
    pMVar1 = AActor::GetClass(stateowner);
    AActor::Pos(&local_68,stateowner);
    pAVar2 = Spawn(pMVar1,&local_68,NO_REPLACE);
    local_50 = pAVar2;
    if (pAVar2 != (AActor *)0x0) {
      (pAVar2->target).field_0 = (stateowner->target).field_0;
      pAVar2->args[0] = 0;
      pAVar2->specialf1 = (stateowner->Angles).Yaw.Degrees;
      FName::FName(&local_6c,"Orbit");
      pFVar3 = AActor::FindState(pAVar2,&local_6c);
      AActor::SetState(pAVar2,pFVar3,false);
    }
    pMVar1 = AActor::GetClass(stateowner);
    AActor::Pos(&local_88,stateowner);
    pAVar2 = Spawn(pMVar1,&local_88,NO_REPLACE);
    local_50 = pAVar2;
    if (pAVar2 != (AActor *)0x0) {
      (pAVar2->target).field_0 = (stateowner->target).field_0;
      pAVar2->args[0] = 1;
      pAVar2->specialf1 = (stateowner->Angles).Yaw.Degrees;
      FName::FName(&local_8c,"Orbit");
      pFVar3 = AActor::FindState(pAVar2,&local_8c);
      AActor::SetState(pAVar2,pFVar3,false);
    }
    (*(stateowner->super_DThinker).super_DObject._vptr_DObject[4])();
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x2ed,"int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcFX2Split)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	mo = Spawn(self->GetClass(), self->Pos(), NO_REPLACE);
	if (mo)
	{
		mo->target = self->target;
		mo->args[0] = 0;									// CW
		mo->specialf1 = self->Angles.Yaw.Degrees;			// Set angle
		mo->SetState (mo->FindState("Orbit"));
	}
	mo = Spawn(self->GetClass(), self->Pos(), NO_REPLACE);
	if (mo)
	{
		mo->target = self->target;
		mo->args[0] = 1;									// CCW
		mo->specialf1 = self->Angles.Yaw.Degrees;			// Set angle
		mo->SetState (mo->FindState("Orbit"));
	}
	self->Destroy ();
	return 0;
}